

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusPreviousWindowIgnoringOne(ImGuiWindow *ignore_window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *in_RDI;
  ImGuiWindow *focus_window;
  ImGuiWindow *window;
  int i;
  ImGuiContext *g;
  ImGuiWindow *window_00;
  int local_14;
  
  pIVar1 = GImGui;
  local_14 = (GImGui->WindowsFocusOrder).Size;
  do {
    local_14 = local_14 + -1;
    if (local_14 < 0) {
      return;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_14);
    window_00 = *ppIVar2;
  } while ((((window_00 == in_RDI) || ((window_00->WasActive & 1U) == 0)) ||
           ((window_00->Flags & 0x1000000U) != 0)) || ((window_00->Flags & 0x40200U) == 0x40200));
  NavRestoreLastChildNavWindow(window_00);
  FocusWindow(window_00);
  return;
}

Assistant:

void ImGui::FocusPreviousWindowIgnoringOne(ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.WindowsFocusOrder.Size - 1; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
}